

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

timediff_t
Curl_pgrsLimitWaitTime
          (curl_off_t cursize,curl_off_t startsize,curl_off_t limit,curltime start,curltime now)

{
  timediff_t tVar1;
  timediff_t tVar2;
  long lVar3;
  long lVar4;
  curltime newer;
  curltime older;
  
  lVar4 = cursize - startsize;
  if (lVar4 != 0 && limit != 0) {
    if (lVar4 < 0x20c49ba5e353f7) {
      lVar3 = (lVar4 * 1000) / limit;
    }
    else {
      lVar3 = 0x7fffffffffffffff;
      if (lVar4 / limit < 0x20c49ba5e353f7) {
        lVar3 = (lVar4 / limit) * 1000;
      }
    }
    older._8_8_ = start._8_8_ & 0xffffffff;
    newer._12_4_ = 0;
    newer.tv_sec = now.tv_sec;
    newer.tv_usec = now.tv_usec;
    older.tv_sec = start.tv_sec;
    tVar1 = Curl_timediff_ceil(newer,older);
    tVar2 = 0;
    if (lVar3 - tVar1 != 0 && tVar1 <= lVar3) {
      tVar2 = lVar3 - tVar1;
    }
    return tVar2;
  }
  return 0;
}

Assistant:

timediff_t Curl_pgrsLimitWaitTime(curl_off_t cursize,
                                  curl_off_t startsize,
                                  curl_off_t limit,
                                  struct curltime start,
                                  struct curltime now)
{
  curl_off_t size = cursize - startsize;
  timediff_t minimum;
  timediff_t actual;

  if(!limit || !size)
    return 0;

  /*
   * 'minimum' is the number of milliseconds 'size' should take to download to
   * stay below 'limit'.
   */
  if(size < CURL_OFF_T_MAX/1000)
    minimum = (timediff_t) (CURL_OFF_T_C(1000) * size / limit);
  else {
    minimum = (timediff_t) (size / limit);
    if(minimum < TIMEDIFF_T_MAX/1000)
      minimum *= 1000;
    else
      minimum = TIMEDIFF_T_MAX;
  }

  /*
   * 'actual' is the time in milliseconds it took to actually download the
   * last 'size' bytes.
   */
  actual = Curl_timediff_ceil(now, start);
  if(actual < minimum) {
    /* if it downloaded the data faster than the limit, make it wait the
       difference */
    return (minimum - actual);
  }

  return 0;
}